

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_CreateTapScriptControlParityBit_Test::TestBody
          (TaprootUtil_CreateTapScriptControlParityBit_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  pointer *this_01;
  initializer_list<cfd::core::ByteData256> __l;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reference this_02;
  char *in_R9;
  TapScriptData *script_data_00;
  ByteData256 *local_b58;
  string local_b10;
  AssertHelper local_af0;
  Message local_ae8;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar__1;
  Message local_ac0;
  string local_ab8;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_5;
  ByteData local_a68;
  ScriptWitness local_a50;
  ByteData local_a30;
  ScriptWitness local_a18;
  undefined1 local_9f8 [8];
  SchnorrSignature schnorr_sig;
  Message local_9c8;
  string local_9c0;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_4;
  SchnorrSignature sig2;
  Message local_960;
  string local_958;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_3;
  SigHashType local_90c;
  undefined1 local_900 [8];
  ByteData256 sighash2;
  undefined1 local_8d0 [8];
  TapScriptData script_data;
  allocator<cfd::core::TxOut> local_859;
  undefined1 local_858 [8];
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxo_list;
  Amount local_808;
  allocator local_7f1;
  string local_7f0;
  undefined1 local_7d0 [8];
  Address addr2;
  undefined1 local_638 [8];
  Transaction tx2;
  Message local_5f0;
  string local_5e8;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_2;
  ScriptWitness local_5a0;
  ScriptWitness local_580;
  undefined1 local_560 [8];
  ByteData der_sig;
  ByteData sig;
  SigHashType local_51c;
  ByteData local_510;
  undefined1 local_4f8 [8];
  ByteData256 sighash;
  SigHashType sighash_type;
  Script pkh_script1;
  string local_490;
  undefined1 local_470 [8];
  Pubkey pk1;
  string local_450;
  undefined1 local_430 [8];
  Privkey key1;
  Message local_408;
  string local_400;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_1;
  Amount amt1;
  string local_3b8;
  Txid local_398;
  undefined1 local_378 [8];
  Transaction tx1;
  ByteData taproot_control;
  Script locking_script;
  undefined1 local_2d0 [8];
  TaprootScriptTree tree;
  string local_238;
  allocator local_211;
  string local_210;
  ByteData256 *local_1f0;
  ByteData256 local_1e8;
  ByteData256 local_1d0;
  undefined1 local_1b8 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  Script redeem_script;
  undefined1 local_140 [8];
  ScriptBuilder builder;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootUtil_CreateTapScriptControlParityBit_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x6d96a4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &builder.script_byte_array_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &builder.script_byte_array_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_140);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_
            );
  cfd::core::ScriptBuilder::AppendData
            ((ScriptBuilder *)local_140,
             (ByteData *)
             &redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_140,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build
            ((Script *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ScriptBuilder *)local_140);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1f0 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_211);
  cfd::core::ByteData256::ByteData256(&local_1e8,&local_210);
  local_1f0 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_238,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57"
             ,(allocator *)
              ((long)&tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_1d0,&local_238);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1b8._0_8_ = &local_1e8;
  local_1b8._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&tree.nodes_.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l._M_len = local_1b8._8_8_;
  __l._M_array = (iterator)local_1b8._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10),__l,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_b58 = (ByteData256 *)local_1b8;
  do {
    local_b58 = local_b58 + -1;
    cfd::core::ByteData256::~ByteData256(local_b58);
  } while (local_b58 != &local_1e8);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_2d0,
             (Script *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),0);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_2d0,pvVar3);
  pvVar3 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),1);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar3);
  cfd::core::TapBranch::AddBranch
            ((TapBranch *)local_2d0,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)
             &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_,
             (TapBranch *)local_2d0,(SchnorrPubkey *)0x0,
             (Script *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Transaction::Transaction((Transaction *)local_378,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3b8,"fee03a31ddbe8f8af75f9ccea23d2d49c27538b1c183aa90c4e35529161a78df"
             ,(allocator *)&amt1.field_0xf);
  cfd::core::Txid::Txid(&local_398,&local_3b8);
  cfd::core::Transaction::AddTxIn
            ((Transaction *)local_378,&local_398,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&amt1.field_0xf);
  cfd::core::Amount::Amount((Amount *)&gtest_ar_1.message_,0x9502f518);
  cfd::core::Transaction::AddTxOut
            ((Transaction *)local_378,(Amount *)&gtest_ar_1.message_,
             (Script *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_400,(AbstractTransaction *)local_378);
  testing::internal::EqHelper<false>::Compare<char[189],std::__cxx11::string>
            ((EqHelper<false> *)local_3e0,
             "\"0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000\""
             ,"tx1.GetHex()",
             (char (*) [189])
             "0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000"
             ,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key1.is_compressed_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key1.is_compressed_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key1.is_compressed_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_450,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::FromWif((Privkey *)local_430,&local_450,kCustomChain,true);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_490,
             "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_470,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ScriptUtil::CreateP2pkhLockingScript
            ((Script *)&sighash_type.hash_algorithm_,(Pubkey *)local_470);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Script::GetData(&local_510,(Script *)&sighash_type.hash_algorithm_);
  cfd::core::SigHashType::SigHashType
            (&local_51c,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Amount::Amount
            ((Amount *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2500000000);
  cfd::core::Transaction::GetSignatureHash
            ((ByteData256 *)local_4f8,(Transaction *)local_378,0,&local_510,&local_51c,
             (Amount *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kVersion0);
  cfd::core::ByteData::~ByteData(&local_510);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_430,
             (ByteData256 *)local_4f8,true);
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)local_560,
             (ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Transaction::AddScriptWitnessStack
            (&local_580,(Transaction *)local_378,0,(ByteData *)local_560);
  cfd::core::ScriptWitness::~ScriptWitness(&local_580);
  cfd::core::Pubkey::GetData((ByteData *)&gtest_ar_2.message_,(Pubkey *)local_470);
  cfd::core::Transaction::AddScriptWitnessStack
            (&local_5a0,(Transaction *)local_378,0,(ByteData *)&gtest_ar_2.message_);
  cfd::core::ScriptWitness::~ScriptWitness(&local_5a0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_2.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_5e8,(AbstractTransaction *)local_378);
  testing::internal::EqHelper<false>::Compare<char[407],std::__cxx11::string>
            ((EqHelper<false> *)local_5c8,
             "\"02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\""
             ,"tx1.GetHex()",
             (char (*) [407])
             "02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000"
             ,&local_5e8);
  std::__cxx11::string::~string((string *)&local_5e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  cfd::core::Transaction::Transaction((Transaction *)local_638,2,0);
  cfd::core::AbstractTransaction::GetTxid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AbstractTransaction *)local_378);
  cfd::core::Transaction::AddTxIn
            ((Transaction *)local_638,
             (Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
             0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7f0,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",&local_7f1);
  cfd::core::Address::Address((Address *)local_7d0,&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  cfd::core::Amount::Amount(&local_808,0x9502f130);
  cfd::core::Address::GetLockingScript
            ((Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Address *)local_7d0);
  cfd::core::Transaction::AddTxOut
            ((Transaction *)local_638,&local_808,
             (Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<cfd::core::TxOut>::allocator(&local_859);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_858,1,&local_859);
  std::allocator<cfd::core::TxOut>::~allocator(&local_859);
  cfd::core::TxOut::TxOut
            ((TxOut *)&script_data.code_separator_position,(Amount *)&gtest_ar_1.message_,
             (Script *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this_02 = std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                      ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_858,0);
  cfd::core::TxOut::operator=(this_02,(TxOut *)&script_data.code_separator_position);
  cfd::core::TxOut::~TxOut((TxOut *)&script_data.code_separator_position);
  cfd::core::TapScriptData::TapScriptData((TapScriptData *)local_8d0);
  cfd::core::TaprootScriptTree::GetTapLeafHash
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(TaprootScriptTree *)local_2d0);
  this_01 = &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::ByteData256::operator=((ByteData256 *)local_8d0,(ByteData256 *)this_01);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)this_01);
  cfd::core::SigHashType::SigHashType
            (&local_90c,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_3.message_);
  script_data_00 = (TapScriptData *)local_8d0;
  cfd::core::Transaction::GetSchnorrSignatureHash
            ((ByteData256 *)local_900,(Transaction *)local_638,0,&local_90c,
             (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_858,script_data_00
             ,(ByteData *)&gtest_ar_3.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_3.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_958,(ByteData256 *)local_900);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_938,
             "\"194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773\"",
             "sighash2.GetHex()",
             (char (*) [65])"194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773",
             &local_958);
  std::__cxx11::string::~string((string *)&local_958);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(&local_960);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_938);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,&local_960);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_960);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar_4.message_,(ByteData256 *)local_900,(Privkey *)local_30);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_
            (&local_9c0,(SchnorrSignature *)&gtest_ar_4.message_,false);
  testing::internal::EqHelper<false>::Compare<char[129],std::__cxx11::string>
            ((EqHelper<false> *)local_9a0,
             "\"bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0"
             ,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar1) {
    testing::Message::Message(&local_9c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  cfd::core::SchnorrSignature::SchnorrSignature
            ((SchnorrSignature *)local_9f8,(SchnorrSignature *)&gtest_ar_4.message_);
  cfd::core::SchnorrSignature::SetSigHashType
            ((SchnorrSignature *)local_9f8,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::SchnorrSignature::GetData(&local_a30,(SchnorrSignature *)local_9f8,true);
  cfd::core::Transaction::AddScriptWitnessStack(&local_a18,(Transaction *)local_638,0,&local_a30);
  cfd::core::ScriptWitness::~ScriptWitness(&local_a18);
  cfd::core::ByteData::~ByteData(&local_a30);
  cfd::core::Script::GetData
            (&local_a68,
             (Script *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Transaction::AddScriptWitnessStack(&local_a50,(Transaction *)local_638,0,&local_a68);
  cfd::core::ScriptWitness::~ScriptWitness(&local_a50);
  cfd::core::ByteData::~ByteData(&local_a68);
  cfd::core::Transaction::AddScriptWitnessStack
            ((ScriptWitness *)&gtest_ar_5.message_,(Transaction *)local_638,0,
             (ByteData *)
             &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar_5.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_ab8,(AbstractTransaction *)local_638);
  testing::internal::EqHelper<false>::Compare<char[569],std::__cxx11::string>
            ((EqHelper<false> *)local_a98,
             "\"020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000\""
             ,"tx2.GetHex()",
             (char (*) [569])
             "020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000"
             ,&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_ac0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_ac0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  local_ad9 = cfd::core::SchnorrPubkey::Verify
                        ((SchnorrPubkey *)&gtest_ar.message_,(SchnorrSignature *)local_9f8,
                         (ByteData256 *)local_900);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
  if (!bVar1) {
    testing::Message::Message(&local_ae8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b10,(internal *)local_ad8,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)script_data_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_af0);
    std::__cxx11::string::~string((string *)&local_b10);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_9f8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar_4.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_900);
  cfd::core::TapScriptData::~TapScriptData((TapScriptData *)local_8d0);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_858);
  cfd::core::Address::~Address((Address *)local_7d0);
  cfd::core::Transaction::~Transaction((Transaction *)local_638);
  cfd::core::ByteData::~ByteData((ByteData *)local_560);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_4f8);
  cfd::core::Script::~Script((Script *)&sighash_type.hash_algorithm_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_470);
  cfd::core::Privkey::~Privkey((Privkey *)local_430);
  cfd::core::Transaction::~Transaction((Transaction *)local_378);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_2d0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10));
  cfd::core::Script::~Script
            ((Script *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_140);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControlParityBit) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  ScriptBuilder builder;
  builder.AppendData(schnorr_pubkey.GetData());
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  Script redeem_script = builder.Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57")
  };
  TaprootScriptTree tree(redeem_script);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, nullptr, &locking_script);

  Transaction tx1(2, 0);
  tx1.AddTxIn(
      Txid("fee03a31ddbe8f8af75f9ccea23d2d49c27538b1c183aa90c4e35529161a78df"),
      0, 0xffffffff);  // bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(amt1, locking_script);
  EXPECT_EQ("0200000001df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016500000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetSignatureHash(0, pkh_script1.GetData(),
        sighash_type, Amount(int64_t{2500000000}), WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("02000000000101df781a162955e3c490aa83c1b13875c2492d3da2ce9c5ff78a8fbedd313ae0fe0000000000ffffffff0118f5029500000000225120262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad4016502473044022068e673ac6db21d612864f432c5cfb64f3652e37be27de412c62dd6127ad63ce1022028507107481ad4fe97da3402eeff0540b0cc1677f9a53e87a7facf07c2696e500121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  Transaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(Amount(int64_t{2499998000}), addr2.GetLockingScript());
  std::vector<TxOut> utxo_list(1);
  utxo_list[0] = TxOut(amt1, locking_script);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetSchnorrSignatureHash(0, sighash_type, utxo_list, &script_data);
  EXPECT_EQ("194c654c0547d805c158711fcf96ed9bc4afbd48556a0632cd2b18ec94c3f773", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e0", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}